

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O3

void __thiscall QTlsPrivate::TlsCryptographOpenSSL::continueHandshake(TlsCryptographOpenSSL *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  qsizetype qVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  QSslSocketPrivate *pQVar8;
  long in_FS_OFFSET;
  NPNContext NVar9;
  uint proto_len;
  uchar *proto;
  EVP_PKEY *key;
  uint local_54;
  uchar *local_50;
  QByteArray local_48;
  QSslConfiguration local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar6 = (long *)QSslSocketPrivate::plainTcpSocket();
  iVar4 = QSslSocketPrivate::tlsMode();
  lVar7 = QSslSocketPrivate::maxReadBufferSize();
  if (lVar7 != 0) {
    (**(code **)(*plVar6 + 0x108))(plVar6,lVar7);
  }
  iVar5 = q_SSL_session_reused(this->ssl);
  if (iVar5 != 0) {
    QTlsBackend::setPeerSessionShared(this->d,true);
  }
  QSslSocket::sslConfiguration();
  cVar2 = QSslConfiguration::testSslOption((SslOption)&local_30);
  if (cVar2 == '\0') {
    bVar3 = QSslContext::cacheSession
                      ((this->sslContextPointer).
                       super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->ssl)
    ;
    if (bVar3) {
      cVar2 = QSslConfiguration::testSslOption((SslOption)&local_30);
      if (cVar2 == '\0') {
        QSslContext::sessionASN1
                  ((this->sslContextPointer).
                   super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        qVar1 = local_48.d.size;
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (qVar1 != 0) {
          pQVar8 = this->d;
          QSslContext::sessionASN1
                    ((this->sslContextPointer).
                     super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          QTlsBackend::setSessionAsn1(pQVar8,&local_48);
          if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        pQVar8 = this->d;
        iVar5 = QSslContext::sessionTicketLifeTimeHint
                          ((this->sslContextPointer).
                           super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        QTlsBackend::setSessionLifetimeHint(pQVar8,iVar5);
      }
    }
    else {
      this_00 = (this->sslContextPointer).
                super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->sslContextPointer).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->sslContextPointer).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  pQVar8 = this->d;
  NVar9 = QSslContext::npnContext
                    ((this->sslContextPointer).
                     super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  QTlsBackend::setAlpnStatus(pQVar8,NVar9.status);
  NVar9 = QSslContext::npnContext
                    ((this->sslContextPointer).
                     super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (NVar9.status == NextProtocolNegotiationUnsupported) {
    pQVar8 = this->d;
    local_48.d.ptr = "http/1.1";
    local_48.d.size = 8;
LAB_0012794e:
    local_48.d.d = (Data *)0x0;
    QTlsBackend::setNegotiatedProtocol(pQVar8,&local_48);
  }
  else {
    local_50 = (uchar *)0x0;
    local_54 = 0;
    q_SSL_get0_alpn_selected(this->ssl,&local_50,&local_54);
    if (iVar4 == 1 && local_54 != 0) {
      QTlsBackend::setAlpnStatus(this->d,NextProtocolNegotiationNegotiated);
    }
    if (local_54 == 0) {
      q_SSL_get0_next_proto_negotiated(this->ssl,&local_50,&local_54);
      if (local_54 == 0) {
        pQVar8 = this->d;
        local_48.d.ptr = (char *)0x0;
        local_48.d.size = 0;
        goto LAB_0012794e;
      }
    }
    pQVar8 = this->d;
    QByteArray::QByteArray(&local_48,(char *)local_50,(ulong)local_54);
    QTlsBackend::setNegotiatedProtocol(pQVar8,&local_48);
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (iVar4 == 1) {
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    lVar7 = q_SSL_ctrl(this->ssl,0x6d,0,&local_48);
    if (lVar7 != 0) {
      pQVar8 = this->d;
      QSslKey::QSslKey((QSslKey *)&local_50,local_48.d.d,PublicKey);
      QTlsBackend::setEphemeralKey(pQVar8,(QSslKey *)&local_50);
      QSslKey::~QSslKey((QSslKey *)&local_50);
    }
  }
  QSslSocketPrivate::setEncrypted(SUB81(this->d,0));
  QSslSocket::encrypted();
  cVar2 = QSslSocketPrivate::isAutoStartingHandshake();
  if (cVar2 != '\0') {
    cVar2 = QSslSocketPrivate::isPendingClose();
    if (cVar2 != '\0') {
      QSslSocketPrivate::setPendingClose(SUB81(this->d,0));
      (**(code **)(*(long *)this->q + 0x100))();
    }
  }
  QSslConfiguration::~QSslConfiguration(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::continueHandshake()
{
    Q_ASSERT(q);
    Q_ASSERT(d);

    auto *plainSocket = d->plainTcpSocket();
    Q_ASSERT(plainSocket);

    const auto mode = d->tlsMode();

    // if we have a max read buffer size, reset the plain socket's to match
    if (const auto maxSize = d->maxReadBufferSize())
        plainSocket->setReadBufferSize(maxSize);

    if (q_SSL_session_reused(ssl))
        QTlsBackend::setPeerSessionShared(d, true);

#ifdef QT_DECRYPT_SSL_TRAFFIC
    if (q_SSL_get_session(ssl)) {
        size_t master_key_len = q_SSL_SESSION_get_master_key(q_SSL_get_session(ssl), nullptr, 0);
        size_t client_random_len = q_SSL_get_client_random(ssl, nullptr, 0);
        QByteArray masterKey(int(master_key_len), Qt::Uninitialized); // Will not overflow
        QByteArray clientRandom(int(client_random_len), Qt::Uninitialized); // Will not overflow

        q_SSL_SESSION_get_master_key(q_SSL_get_session(ssl),
                                     reinterpret_cast<unsigned char*>(masterKey.data()),
                                     masterKey.size());
        q_SSL_get_client_random(ssl, reinterpret_cast<unsigned char *>(clientRandom.data()),
                                clientRandom.size());

        QByteArray debugLineClientRandom("CLIENT_RANDOM ");
        debugLineClientRandom.append(clientRandom.toHex().toUpper());
        debugLineClientRandom.append(" ");
        debugLineClientRandom.append(masterKey.toHex().toUpper());
        debugLineClientRandom.append("\n");

        QString sslKeyFile = QDir::tempPath() + "/qt-ssl-keys"_L1;
        QFile file(sslKeyFile);
        if (!file.open(QIODevice::Append))
            qCWarning(lcTlsBackend) << "could not open file" << sslKeyFile << "for appending";
        if (!file.write(debugLineClientRandom))
            qCWarning(lcTlsBackend) << "could not write to file" << sslKeyFile;
        file.close();
    } else {
        qCWarning(lcTlsBackend, "could not decrypt SSL traffic");
    }
#endif // QT_DECRYPT_SSL_TRAFFIC

    const auto &configuration = q->sslConfiguration();
    // Cache this SSL session inside the QSslContext
    if (!(configuration.testSslOption(QSsl::SslOptionDisableSessionSharing))) {
        if (!sslContextPointer->cacheSession(ssl)) {
            sslContextPointer.reset(); // we could not cache the session
        } else {
            // Cache the session for permanent usage as well
            if (!(configuration.testSslOption(QSsl::SslOptionDisableSessionPersistence))) {
                if (!sslContextPointer->sessionASN1().isEmpty())
                    QTlsBackend::setSessionAsn1(d, sslContextPointer->sessionASN1());
                QTlsBackend::setSessionLifetimeHint(d, sslContextPointer->sessionTicketLifeTimeHint());
            }
        }
    }

#if !defined(OPENSSL_NO_NEXTPROTONEG)

    QTlsBackend::setAlpnStatus(d, sslContextPointer->npnContext().status);
    if (sslContextPointer->npnContext().status == QSslConfiguration::NextProtocolNegotiationUnsupported) {
        // we could not agree -> be conservative and use HTTP/1.1
        // T.P.: I have to admit, this is a really strange notion of 'conservative',
        // given the protocol-neutral nature of ALPN/NPN.
        QTlsBackend::setNegotiatedProtocol(d, QByteArrayLiteral("http/1.1"));
    } else {
        const unsigned char *proto = nullptr;
        unsigned int proto_len = 0;

        q_SSL_get0_alpn_selected(ssl, &proto, &proto_len);
        if (proto_len && mode == QSslSocket::SslClientMode) {
            // Client does not have a callback that sets it ...
            QTlsBackend::setAlpnStatus(d, QSslConfiguration::NextProtocolNegotiationNegotiated);
        }

        if (!proto_len) { // Test if NPN was more lucky ...
            q_SSL_get0_next_proto_negotiated(ssl, &proto, &proto_len);
        }

        if (proto_len)
            QTlsBackend::setNegotiatedProtocol(d, QByteArray(reinterpret_cast<const char *>(proto), proto_len));
        else
            QTlsBackend::setNegotiatedProtocol(d,{});
    }
#endif // !defined(OPENSSL_NO_NEXTPROTONEG)

    if (mode == QSslSocket::SslClientMode) {
        EVP_PKEY *key;
        if (q_SSL_get_server_tmp_key(ssl, &key))
            QTlsBackend::setEphemeralKey(d, QSslKey(key, QSsl::PublicKey));
    }

    d->setEncrypted(true);
    emit q->encrypted();
    if (d->isAutoStartingHandshake() && d->isPendingClose()) {
        d->setPendingClose(false);
        q->disconnectFromHost();
    }
}